

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_7x7(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  JSAMPLE *pJVar5;
  void *pvVar6;
  JSAMPROW pJVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  int aiStack_f8 [14];
  undefined4 auStack_c0 [7];
  undefined4 auStack_a4 [7];
  undefined4 local_88 [7];
  undefined4 auStack_6c [7];
  undefined4 auStack_50 [8];
  
  pJVar5 = cinfo->sample_range_limit;
  pvVar6 = compptr->dct_table;
  lVar14 = 0;
  do {
    lVar17 = (long)*(short *)((long)pvVar6 + lVar14 * 2) * (long)coef_block[lVar14] * 0x2000;
    lVar19 = (long)*(short *)((long)pvVar6 + lVar14 * 2 + 0x20) * (long)coef_block[lVar14 + 0x10];
    lVar29 = (long)*(short *)((long)pvVar6 + lVar14 * 2 + 0x40) * (long)coef_block[lVar14 + 0x20];
    lVar10 = (long)*(short *)((long)pvVar6 + lVar14 * 2 + 0x60) * (long)coef_block[lVar14 + 0x30];
    lVar32 = (lVar29 - lVar10) * 0x1c37;
    lVar25 = (lVar19 - lVar29) * 0xa12;
    lVar20 = lVar29 * -0x3aeb + lVar17 + 0x400 + lVar25 + lVar32;
    lVar22 = (lVar10 + lVar19) * 0x28c6 + lVar17 + 0x400;
    lVar11 = lVar10 * -0x27d + lVar32 + lVar22;
    lVar22 = lVar19 * -0x4f0f + lVar25 + lVar22;
    lVar33 = (long)*(short *)((long)pvVar6 + lVar14 * 2 + 0x10) * (long)coef_block[lVar14 + 8];
    lVar23 = (long)*(short *)((long)pvVar6 + lVar14 * 2 + 0x30) * (long)coef_block[lVar14 + 0x18];
    lVar26 = (long)*(short *)((long)pvVar6 + lVar14 * 2 + 0x50) * (long)coef_block[lVar14 + 0x28];
    lVar25 = (lVar23 + lVar33) * 0x1def;
    lVar24 = (lVar23 + lVar26) * -0x2c1f;
    lVar32 = lVar25 + (lVar33 - lVar23) * 0x573 + lVar24;
    lVar13 = (lVar33 + lVar26) * 0x13a3;
    lVar25 = lVar25 + (lVar33 - lVar23) * -0x573 + lVar13;
    lVar24 = lVar26 * 0x3bde + lVar13 + lVar24;
    aiStack_f8[lVar14] = (int)((ulong)(lVar25 + lVar11) >> 0xb);
    auStack_50[lVar14] = (int)((ulong)(lVar11 - lVar25) >> 0xb);
    aiStack_f8[lVar14 + 7] = (int)((ulong)(lVar32 + lVar20) >> 0xb);
    auStack_6c[lVar14] = (int)((ulong)(lVar20 - lVar32) >> 0xb);
    auStack_c0[lVar14] = (int)((ulong)(lVar24 + lVar22) >> 0xb);
    local_88[lVar14] = (int)((ulong)(lVar22 - lVar24) >> 0xb);
    auStack_a4[lVar14] = (int)(lVar17 + (lVar29 - (lVar10 + lVar19)) * 0x2d41 + 0x400U >> 0xb);
    lVar14 = lVar14 + 1;
  } while ((int)lVar14 != 7);
  uVar8 = (ulong)output_col;
  lVar14 = 0;
  do {
    iVar28 = *(int *)((long)aiStack_f8 + lVar14 + 4);
    iVar1 = *(int *)((long)aiStack_f8 + lVar14 + 8);
    iVar15 = *(int *)((long)aiStack_f8 + lVar14) * 0x2000;
    iVar2 = *(int *)((long)aiStack_f8 + lVar14 + 0x10);
    iVar3 = *(int *)((long)aiStack_f8 + lVar14 + 0x18);
    iVar9 = (iVar2 - iVar3) * 0x1c37;
    iVar30 = (iVar1 - iVar2) * 0xa12;
    iVar21 = (iVar3 + iVar1) * 0x28c6 + iVar15 + 0x20000;
    iVar16 = iVar2 * -0x3aeb + iVar15 + 0x20000 + iVar30 + iVar9;
    iVar4 = *(int *)((long)aiStack_f8 + lVar14 + 0xc);
    iVar18 = iVar3 * -0x27d + iVar9 + iVar21;
    iVar9 = *(int *)((long)aiStack_f8 + lVar14 + 0x14);
    iVar27 = (iVar4 + iVar28) * 0x1def;
    iVar21 = iVar1 * -0x4f0f + iVar30 + iVar21;
    iVar12 = (iVar28 + iVar9) * 0x13a3;
    iVar31 = iVar27 + (iVar28 - iVar4) * -0x573 + iVar12;
    iVar30 = (iVar4 + iVar9) * -0x2c1f;
    iVar28 = iVar27 + (iVar28 - iVar4) * 0x573 + iVar30;
    iVar30 = iVar9 * 0x3bde + iVar12 + iVar30;
    pJVar7 = *output_buf;
    pJVar7[uVar8] = pJVar5[(ulong)((uint)(iVar31 + iVar18) >> 0x12 & 0x3ff) + 0x80];
    pJVar7[uVar8 + 6] = pJVar5[(ulong)((uint)(iVar18 - iVar31) >> 0x12 & 0x3ff) + 0x80];
    pJVar7[uVar8 + 1] = pJVar5[(ulong)((uint)(iVar28 + iVar16) >> 0x12 & 0x3ff) + 0x80];
    pJVar7[uVar8 + 5] = pJVar5[(ulong)((uint)(iVar16 - iVar28) >> 0x12 & 0x3ff) + 0x80];
    pJVar7[uVar8 + 2] = pJVar5[(ulong)((uint)(iVar30 + iVar21) >> 0x12 & 0x3ff) + 0x80];
    pJVar7[uVar8 + 4] = pJVar5[(ulong)((uint)(iVar21 - iVar30) >> 0x12 & 0x3ff) + 0x80];
    pJVar7[uVar8 + 3] =
         pJVar5[(ulong)(iVar15 + (iVar2 - (iVar3 + iVar1)) * 0x2d41 + 0x20000U >> 0x12 & 0x3ff) +
                0x80];
    output_buf = output_buf + 1;
    lVar14 = lVar14 + 0x1c;
  } while (lVar14 != 0xc4);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_7x7(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[7 * 7];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 7; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp13 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp13 = LEFT_SHIFT(tmp13, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp13 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = MULTIPLY(z2 - z3, FIX(0.881747734));     /* c4 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.314692123));     /* c6 */
    tmp11 = tmp10 + tmp12 + tmp13 - MULTIPLY(z2, FIX(1.841218003)); /* c2+c4-c6 */
    tmp0 = z1 + z3;
    z2 -= tmp0;
    tmp0 = MULTIPLY(tmp0, FIX(1.274162392)) + tmp13; /* c2 */
    tmp10 += tmp0 - MULTIPLY(z3, FIX(0.077722536));  /* c2-c4-c6 */
    tmp12 += tmp0 - MULTIPLY(z1, FIX(2.470602249));  /* c2+c4+c6 */
    tmp13 += MULTIPLY(z2, FIX(1.414213562));         /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);

    tmp1 = MULTIPLY(z1 + z2, FIX(0.935414347));      /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(z1 - z2, FIX(0.170262339));      /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(z2 + z3, -FIX(1.378756276));     /* -c1 */
    tmp1 += tmp2;
    z2 = MULTIPLY(z1 + z3, FIX(0.613604268));        /* c5 */
    tmp0 += z2;
    tmp2 += z2 + MULTIPLY(z3, FIX(1.870828693));     /* c3+c1-c5 */

    /* Final output stage */

    wsptr[7 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[7 * 6] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[7 * 1] = (int)RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[7 * 5] = (int)RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[7 * 2] = (int)RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[7 * 4] = (int)RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[7 * 3] = (int)RIGHT_SHIFT(tmp13, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 7 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 7; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp13 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp13 = LEFT_SHIFT(tmp13, CONST_BITS);

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[4];
    z3 = (JLONG)wsptr[6];

    tmp10 = MULTIPLY(z2 - z3, FIX(0.881747734));     /* c4 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.314692123));     /* c6 */
    tmp11 = tmp10 + tmp12 + tmp13 - MULTIPLY(z2, FIX(1.841218003)); /* c2+c4-c6 */
    tmp0 = z1 + z3;
    z2 -= tmp0;
    tmp0 = MULTIPLY(tmp0, FIX(1.274162392)) + tmp13; /* c2 */
    tmp10 += tmp0 - MULTIPLY(z3, FIX(0.077722536));  /* c2-c4-c6 */
    tmp12 += tmp0 - MULTIPLY(z1, FIX(2.470602249));  /* c2+c4+c6 */
    tmp13 += MULTIPLY(z2, FIX(1.414213562));         /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];

    tmp1 = MULTIPLY(z1 + z2, FIX(0.935414347));      /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(z1 - z2, FIX(0.170262339));      /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(z2 + z3, -FIX(1.378756276));     /* -c1 */
    tmp1 += tmp2;
    z2 = MULTIPLY(z1 + z3, FIX(0.613604268));        /* c5 */
    tmp0 += z2;
    tmp2 += z2 + MULTIPLY(z3, FIX(1.870828693));     /* c3+c1-c5 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12 + tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp12 - tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 7;         /* advance pointer to next row */
  }
}